

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::Picker::_q_rowsInserted(Picker *this,QModelIndex *parent,int start,int end)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  QModelIndex QStack_58;
  QModelIndex local_40;
  
  pPVar1 = (this->d).d;
  if (pPVar1->inserting == false) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&QStack_58,&pPVar1->root);
    bVar3 = QModelIndex::operator!=(parent,&QStack_58);
    if (!bVar3) {
      if (((start == 0) && (iVar5 = count(this), end + 1 == iVar5)) &&
         (cVar4 = QPersistentModelIndex::isValid(), cVar4 == '\0')) {
        pPVar1 = (this->d).d;
        pQVar2 = pPVar1->model;
        iVar5 = pPVar1->modelColumn;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&pPVar1->root);
        (**(code **)(*(long *)pQVar2 + 0x60))(&QStack_58,pQVar2,0,iVar5,&local_40);
        QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,&QStack_58);
        setCurrentIndex(this,0);
        return;
      }
      iVar5 = QPersistentModelIndex::row();
      pPVar1 = (this->d).d;
      if (iVar5 == pPVar1->indexBeforeChange) {
        bVar3 = PickerPrivate::isRowsVisible(pPVar1,start,end);
        if (bVar3) {
          QWidget::update();
        }
      }
      else {
        QWidget::update();
        QPersistentModelIndex::operator_cast_to_QModelIndex(&QStack_58,&((this->d).d)->currentIndex)
        ;
        _q_emitCurrentIndexChanged(this,&QStack_58);
      }
    }
  }
  return;
}

Assistant:

void
Picker::_q_rowsInserted( const QModelIndex & parent, int start, int end )
{
	if( d->inserting || parent != d->root )
		return;

	// set current index if picker was previously empty
	if( start == 0 && ( end - start + 1 ) == count() &&
		!d->currentIndex.isValid() )
	{
		d->topItemIndex = d->model->index( 0, d->modelColumn, d->root );
		setCurrentIndex( 0 );
	}
	// need to emit changed if model updated index "silently"
	else if( d->currentIndex.row() != d->indexBeforeChange )
	{
		update();
		_q_emitCurrentIndexChanged( d->currentIndex );
	}
	else if( d->isRowsVisible( start, end ) )
		update();
}